

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

int Abc_NtkClauseAnd(sat_solver *pSat,Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,Vec_Int_t *vVars)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  int iVar3;
  lit lVar4;
  Abc_Obj_t *pAVar5;
  int local_40;
  int i;
  int Var1;
  int Var;
  int fComp1;
  Vec_Int_t *vVars_local;
  Vec_Ptr_t *vSuper_local;
  Abc_Obj_t *pNode_local;
  sat_solver *pSat_local;
  
  iVar2 = Abc_ObjIsComplement(pNode);
  if (iVar2 != 0) {
    __assert_fail("!Abc_ObjIsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                  ,0xe5,"int Abc_NtkClauseAnd(sat_solver *, Abc_Obj_t *, Vec_Ptr_t *, Vec_Int_t *)")
    ;
  }
  iVar2 = Abc_ObjIsNode(pNode);
  if (iVar2 != 0) {
    iVar2 = (pNode->field_6).iTemp;
    local_40 = 0;
    while( true ) {
      if (vSuper->nSize <= local_40) {
        vVars->nSize = 0;
        for (local_40 = 0; local_40 < vSuper->nSize; local_40 = local_40 + 1) {
          iVar3 = Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[local_40]);
          pAVar5 = Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[local_40]);
          lVar4 = toLitCond((pAVar5->field_6).iTemp,(uint)((iVar3 != 0 ^ 0xffU) & 1));
          Vec_IntPush(vVars,lVar4);
        }
        lVar4 = toLitCond(iVar2,0);
        Vec_IntPush(vVars,lVar4);
        iVar2 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
        return iVar2;
      }
      iVar3 = Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[local_40]);
      pAVar5 = Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[local_40]);
      aVar1 = pAVar5->field_6;
      vVars->nSize = 0;
      lVar4 = toLitCond(aVar1.iTemp,iVar3);
      Vec_IntPush(vVars,lVar4);
      lVar4 = toLitCond(iVar2,1);
      Vec_IntPush(vVars,lVar4);
      iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
      if (iVar3 == 0) break;
      local_40 = local_40 + 1;
    }
    return 0;
  }
  __assert_fail("Abc_ObjIsNode( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                ,0xe6,"int Abc_NtkClauseAnd(sat_solver *, Abc_Obj_t *, Vec_Ptr_t *, Vec_Int_t *)");
}

Assistant:

int Abc_NtkClauseAnd( sat_solver * pSat, Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, Vec_Int_t * vVars )
{
    int fComp1, Var, Var1, i;
//printf( "Adding AND %d.  (%d)    %d\n", pNode->Id, vSuper->nSize+1, (int)pSat->sat_solver_stats.clauses );

    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_ObjIsNode( pNode ) );

//    nVars = sat_solver_nvars(pSat);
    Var = (int)(ABC_PTRINT_T)pNode->pCopy;
//    Var = pNode->Id;

//    assert( Var  < nVars ); 
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        // get the predecessor nodes
        // get the complemented attributes of the nodes
        fComp1 = Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]);
        // determine the variable numbers
        Var1 = (int)(ABC_PTRINT_T)Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i])->pCopy;
//        Var1 = (int)Abc_ObjRegular(vSuper->pArray[i])->Id;

        // check that the variables are in the SAT manager
//        assert( Var1 < nVars );

        // suppose the AND-gate is A * B = C
        // add !A => !C   or   A + !C
    //  fprintf( pFile, "%d %d 0%c", Var1, -Var, 10 );
        vVars->nSize = 0;
        Vec_IntPush( vVars, toLitCond(Var1, fComp1) );
        Vec_IntPush( vVars, toLitCond(Var,  1     ) );
        if ( !sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize ) )
            return 0;
    }

    // add A & B => C   or   !A + !B + C
//  fprintf( pFile, "%d %d %d 0%c", -Var1, -Var2, Var, 10 );
    vVars->nSize = 0;
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        // get the predecessor nodes
        // get the complemented attributes of the nodes
        fComp1 = Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]);
        // determine the variable numbers
        Var1 = (int)(ABC_PTRINT_T)Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i])->pCopy;
//        Var1 = (int)Abc_ObjRegular(vSuper->pArray[i])->Id;
        // add this variable to the array
        Vec_IntPush( vVars, toLitCond(Var1, !fComp1) );
    }
    Vec_IntPush( vVars, toLitCond(Var, 0) );
    return sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
}